

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setOSAndEnvironmentName(Triple *this,StringRef Str)

{
  StringRef local_108;
  StringRef local_f8;
  StringRef local_e8;
  Twine local_d8;
  Twine local_c0;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  local_e8.Length = Str.Length;
  local_e8.Data = Str.Data;
  local_f8 = getArchName(this);
  Twine::Twine(&local_90,&local_f8,"-");
  local_108 = getVendorName(this);
  Twine::Twine(&local_a8,&local_108);
  Twine::concat(&local_78,&local_90,&local_a8);
  Twine::Twine(&local_c0,"-");
  Twine::concat(&local_60,&local_78,&local_c0);
  Twine::Twine(&local_d8,&local_e8);
  Twine::concat(&local_48,&local_60,&local_d8);
  setTriple(this,&local_48);
  return;
}

Assistant:

void Triple::setOSAndEnvironmentName(StringRef Str) {
  setTriple(getArchName() + "-" + getVendorName() + "-" + Str);
}